

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

void __thiscall
duckdb::RowGroup::TemplatedScan<(duckdb::TableScanType)2>
          (RowGroup *this,TransactionData transaction,CollectionScanState *state,DataChunk *result)

{
  double *pdVar1;
  BlockManager *pBVar2;
  size_type __n;
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ColumnScanState_*,_false> _Var4;
  data_ptr_t pdVar5;
  long lVar6;
  bool bVar7;
  undefined8 uVar8;
  bool bVar9;
  FilterPropagateResult FVar10;
  int iVar11;
  const_reference pvVar12;
  ColumnData *pCVar13;
  reference pvVar14;
  const_reference pvVar15;
  reference pvVar16;
  ulong uVar17;
  const_iterator __begin5;
  pointer pSVar18;
  size_type __n_00;
  idx_t iVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  long lVar21;
  TableScanState *pTVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  ulong uVar24;
  size_type sVar25;
  pointer pSVar26;
  double dVar27;
  idx_t approved_tuple_count;
  optional_ptr<duckdb::AdaptiveFilter,_true> adaptive_filter;
  PrefetchState prefetch_state;
  optional_ptr<duckdb::DuckTransaction,_true> in_stack_fffffffffffffed8;
  undefined1 local_100 [72];
  transaction_t local_b8;
  atomic<unsigned_long> aStack_b0;
  type local_a8;
  _Head_base<0UL,_duckdb::AdaptiveFilter_*,_false> local_a0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_98;
  RandomEngine *local_90;
  _Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
  local_88;
  optional_ptr<duckdb::UndoBufferEntry,_true> local_80;
  undefined1 local_78 [64];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pTVar22 = state->parent;
  local_100._32_8_ = &pTVar22->column_ids;
  local_100._48_8_ = &pTVar22->filters;
  local_90 = &state->random;
  local_80.ptr = (UndoBufferEntry *)&(pTVar22->filters).filter_list;
  local_88.super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>)(UndoBufferEntry *)0xffffffffffffffff;
  local_100._8_8_ = this;
  local_100._16_8_ = result;
  local_100._24_8_ = pTVar22;
  do {
    local_100._40_8_ = state->vector_index * 0x800;
    p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (state->max_row_group_row + state->vector_index * -0x800);
    if (state->max_row_group_row < (ulong)local_100._40_8_ ||
        p_Var23 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7ff < p_Var23) {
      p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
    }
    if (((state->parent->sampling_info).do_system_sample != true) ||
       (dVar27 = RandomEngine::NextRandom(local_90),
       pdVar1 = &(state->parent->sampling_info).sample_rate, dVar27 < *pdVar1 || dVar27 == *pdVar1))
    {
      bVar9 = CheckZonemapSegments((RowGroup *)local_100._8_8_,state);
      bVar7 = true;
      if (bVar9) {
        pBVar2 = ((reference<RowGroupCollection> *)(local_100._8_8_ + 0x20))->_M_data->block_manager
        ;
        iVar11 = (*pBVar2->_vptr_BlockManager[0x12])(pBVar2);
        if ((char)iVar11 != '\0') {
          local_78._0_8_ = (LocalStorage *)0x0;
          local_78._8_8_ = (StorageLockKey *)0x0;
          local_78._16_8_ = (pointer)0x0;
          if ((pTVar22->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar22->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar21 = 0;
            sVar25 = 0;
            do {
              pvVar12 = vector<duckdb::StorageIndex,_true>::operator[]
                                  ((vector<duckdb::StorageIndex,_true> *)local_100._32_8_,sVar25);
              if (pvVar12->index != 0xffffffffffffffff) {
                pCVar13 = GetColumn((RowGroup *)local_100._8_8_,pvVar12->index);
                (*pCVar13->_vptr_ColumnData[6])
                          (pCVar13,local_78,
                           (long)&((state->column_scans).
                                   super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                   .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                  _M_head_impl)->current + lVar21,p_Var23);
              }
              sVar25 = sVar25 + 1;
              lVar21 = lVar21 + 0x98;
            } while (sVar25 < (ulong)((long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                            (local_100._24_8_ + 0x1c0))->_vptr__Sp_counted_base -
                                      *(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                (local_100._24_8_ + 0x1b0))->_M_use_count >> 5));
          }
          (*pBVar2->buffer_manager->_vptr_BufferManager[8])
                    (pBVar2->buffer_manager,(PrefetchState *)local_78);
          PrefetchState::~PrefetchState((PrefetchState *)local_78);
          pTVar22 = (TableScanState *)local_100._24_8_;
        }
        local_100._56_8_ = p_Var23;
        if ((((optional_ptr<duckdb::TableFilterSet,_true> *)local_100._48_8_)->ptr ==
             (TableFilterSet *)0x0) ||
           ((ulong)(((long)(pTVar22->filters).filter_list.
                           super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                           super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pTVar22->filters).filter_list.
                           super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                           super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) <=
            (pTVar22->filters).always_true_filters)) {
          if ((pTVar22->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar22->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar21 = 0;
            sVar25 = 0;
            do {
              pvVar12 = vector<duckdb::StorageIndex,_true>::operator[]
                                  ((vector<duckdb::StorageIndex,_true> *)local_100._32_8_,sVar25);
              if (pvVar12->index == 0xffffffffffffffff) {
                pvVar16 = vector<duckdb::Vector,_true>::operator[]
                                    ((vector<duckdb::Vector,_true> *)local_100._16_8_,sVar25);
                Vector::Sequence(pvVar16,((SegmentBase<duckdb::RowGroup> *)local_100._8_8_)->start +
                                         local_100._40_8_,1,(idx_t)p_Var23);
              }
              else {
                pCVar13 = GetColumn((RowGroup *)local_100._8_8_,pvVar12->index);
                iVar19 = state->vector_index;
                _Var4._M_head_impl =
                     (state->column_scans).
                     super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                     .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
                pvVar16 = vector<duckdb::Vector,_true>::operator[]
                                    ((vector<duckdb::Vector,_true> *)local_100._16_8_,sVar25);
                p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._56_8_;
                pTVar22 = (TableScanState *)local_100._24_8_;
                uVar24 = (pCVar13->count).super___atomic_base<unsigned_long>._M_i + iVar19 * -0x800;
                if (0x7ff < uVar24) {
                  uVar24 = 0x800;
                }
                (*pCVar13->_vptr_ColumnData[10])
                          (pCVar13,iVar19,(long)&(_Var4._M_head_impl)->current + lVar21,pvVar16,0,
                           uVar24);
              }
              sVar25 = sVar25 + 1;
              lVar21 = lVar21 + 0x98;
            } while (sVar25 < (ulong)((long)(pTVar22->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pTVar22->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
LAB_0110591e:
          (((shared_ptr<duckdb::DatabaseInstance,_true> *)(local_100._16_8_ + 0x10))->internal).
          super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = p_Var23;
          state->vector_index = state->vector_index + 1;
          return;
        }
        local_b8 = 0;
        aStack_b0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
        local_a0._M_head_impl =
             (pTVar22->filters).adaptive_filter.
             super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>
             .super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl;
        local_100._64_8_ = 0;
        local_100._0_8_ = p_Var23;
        local_98.__d.__r = (duration)ScanFilterInfo::BeginFilter((ScanFilterInfo *)local_100._48_8_)
        ;
        pSVar18 = (pTVar22->filters).filter_list.
                  super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                  super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar26 = (pTVar22->filters).filter_list.
                  super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                  super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (pSVar26 != pSVar18) {
          __n_00 = 0;
          do {
            optional_ptr<duckdb::AdaptiveFilter,_true>::CheckValid
                      ((optional_ptr<duckdb::AdaptiveFilter,_true> *)&local_a0);
            pvVar14 = vector<unsigned_long,_true>::operator[]
                                (&(local_a0._M_head_impl)->permutation,__n_00);
            pvVar15 = vector<duckdb::ScanFilter,_true>::operator[]
                                ((vector<duckdb::ScanFilter,_true> *)local_80.ptr,*pvVar14);
            if (pvVar15->always_true == false) {
              local_a8 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                         ::operator*(&pvVar15->filter_state);
              __n = pvVar15->scan_column_index;
              _Var3._M_head_impl = (UndoBufferEntry *)pvVar15->table_column_index;
              pvVar16 = vector<duckdb::Vector,_true>::operator[]
                                  ((vector<duckdb::Vector,_true> *)local_100._16_8_,__n);
              if ((_Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>)_Var3._M_head_impl ==
                  local_88.super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl) {
                iVar19 = ((SegmentBase<duckdb::RowGroup> *)local_100._8_8_)->start +
                         local_100._40_8_;
                FVar10 = CheckRowIdFilter(pvVar15->filter,iVar19,
                                          (long)(_func_int ***)local_100._56_8_ + iVar19);
                pTVar22 = (TableScanState *)local_100._24_8_;
                if (FVar10 == FILTER_ALWAYS_FALSE) {
                  local_100._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                }
                else {
                  Vector::SetVectorType(pvVar16,FLAT_VECTOR);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._0_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    pdVar5 = pvVar16->data;
                    p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    do {
                      p_Var20 = p_Var23;
                      if (local_100._64_8_ != 0) {
                        p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  (ulong)*(uint *)(local_100._64_8_ + (long)p_Var23 * 4);
                      }
                      *(idx_t *)(pdVar5 + (long)p_Var20 * 8) =
                           (long)&p_Var20->_vptr__Sp_counted_base +
                           ((SegmentBase<duckdb::RowGroup> *)local_100._8_8_)->start +
                           local_100._40_8_;
                      p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                ((long)&p_Var23->_vptr__Sp_counted_base + 1);
                    } while (p_Var23 < (ulong)local_100._0_8_);
                  }
                  if (FVar10 != FILTER_ALWAYS_TRUE) {
                    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
                    Vector::ToUnifiedFormat(pvVar16,local_100._0_8_,(UnifiedVectorFormat *)local_78)
                    ;
                    in_stack_fffffffffffffed8.ptr = (DuckTransaction *)local_100;
                    ColumnSegment::FilterSelection
                              ((SelectionVector *)(local_100 + 0x40),pvVar16,
                               (UnifiedVectorFormat *)local_78,pvVar15->filter,local_a8,
                               local_100._0_8_,(idx_t *)in_stack_fffffffffffffed8.ptr);
                    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_38._M_pi);
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._32_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._32_8_);
                    }
                  }
                }
              }
              else {
                pCVar13 = GetColumn((RowGroup *)local_100._8_8_,pvVar15->table_column_index);
                pTVar22 = (TableScanState *)local_100._24_8_;
                in_stack_fffffffffffffed8.ptr = transaction.transaction.ptr;
                (*pCVar13->_vptr_ColumnData[0xd])
                          (pCVar13,state->vector_index,
                           (state->column_scans).
                           super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                           .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl +
                           __n,pvVar16,local_100 + 0x40,local_100,transaction.transaction.ptr,
                           transaction.transaction_id,transaction.start_time,pvVar15->filter,
                           local_a8);
              }
            }
            __n_00 = __n_00 + 1;
            pSVar18 = (pTVar22->filters).filter_list.
                      super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                      super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pSVar26 = (pTVar22->filters).filter_list.
                      super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                      super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._56_8_;
          } while (__n_00 < (ulong)(((long)pSVar26 - (long)pSVar18 >> 3) * -0x3333333333333333));
        }
        for (; uVar8 = local_100._0_8_, pSVar18 != pSVar26; pSVar18 = pSVar18 + 1) {
          if (pSVar18->always_true == false) {
            pvVar16 = vector<duckdb::Vector,_true>::operator[]
                                ((vector<duckdb::Vector,_true> *)local_100._16_8_,
                                 pSVar18->scan_column_index);
            Vector::Slice(pvVar16,(SelectionVector *)(local_100 + 0x40),local_100._0_8_);
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._0_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          DataChunk::Reset((DataChunk *)local_100._16_8_);
          if ((pTVar22->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar22->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar21 = 0;
            uVar24 = 0;
            do {
              pvVar12 = vector<duckdb::StorageIndex,_true>::operator[]
                                  ((vector<duckdb::StorageIndex,_true> *)local_100._32_8_,uVar24);
              if (pvVar12->index != 0xffffffffffffffff) {
                lVar6 = (long)(pTVar22->filters).column_has_filter.
                              super_vector<bool,_std::allocator<bool>_>.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                if (uVar24 < (ulong)(pTVar22->filters).column_has_filter.
                                    super_vector<bool,_std::allocator<bool>_>.
                                    super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                    _M_offset +
                             ((long)(pTVar22->filters).column_has_filter.
                                    super_vector<bool,_std::allocator<bool>_>.
                                    super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                             - lVar6) * 8) {
                  uVar17 = uVar24 + 0x3f;
                  if (-1 < (long)uVar24) {
                    uVar17 = uVar24;
                  }
                  if ((*(ulong *)(lVar6 + ((long)uVar17 >> 6) * 8 + -8 +
                                 (ulong)((uVar24 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                       (uVar24 & 0x3f) & 1) != 0) goto LAB_011057e6;
                }
                pCVar13 = GetColumn((RowGroup *)local_100._8_8_,pvVar12->index);
                (*pCVar13->_vptr_ColumnData[0x10])
                          (pCVar13,(long)&((state->column_scans).
                                           super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                           ._M_t.
                                           super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                           .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                          _M_head_impl)->current + lVar21,0x800);
              }
LAB_011057e6:
              uVar24 = uVar24 + 1;
              lVar21 = lVar21 + 0x98;
            } while (uVar24 < (ulong)((long)(pTVar22->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pTVar22->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          state->vector_index = state->vector_index + 1;
          bVar7 = true;
        }
        else {
          if ((pTVar22->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar22->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            uVar24 = 0;
            do {
              lVar21 = (long)(pTVar22->filters).column_has_filter.
                             super_vector<bool,_std::allocator<bool>_>.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              if (uVar24 < (ulong)(pTVar22->filters).column_has_filter.
                                  super_vector<bool,_std::allocator<bool>_>.
                                  super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                  _M_offset +
                           ((long)(pTVar22->filters).column_has_filter.
                                  super_vector<bool,_std::allocator<bool>_>.
                                  super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                           lVar21) * 8) {
                uVar17 = uVar24 + 0x3f;
                if (-1 < (long)uVar24) {
                  uVar17 = uVar24;
                }
                if ((*(ulong *)(lVar21 + ((long)uVar17 >> 6) * 8 + -8 +
                               (ulong)((uVar24 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                     (uVar24 & 0x3f) & 1) == 0) goto LAB_01105620;
              }
              else {
LAB_01105620:
                pvVar12 = vector<duckdb::StorageIndex,_true>::operator[]
                                    ((vector<duckdb::StorageIndex,_true> *)local_100._32_8_,uVar24);
                if (pvVar12->index == 0xffffffffffffffff) {
                  pvVar16 = vector<duckdb::Vector,_true>::operator[]
                                      ((vector<duckdb::Vector,_true> *)local_100._16_8_,uVar24);
                  Vector::SetVectorType(pvVar16,FLAT_VECTOR);
                  pvVar16 = vector<duckdb::Vector,_true>::operator[]
                                      ((vector<duckdb::Vector,_true> *)local_100._16_8_,uVar24);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._0_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    pdVar5 = pvVar16->data;
                    p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    do {
                      p_Var20 = p_Var23;
                      if (local_100._64_8_ != 0) {
                        p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  (ulong)*(uint *)(local_100._64_8_ + (long)p_Var23 * 4);
                      }
                      *(idx_t *)(pdVar5 + (long)p_Var23 * 8) =
                           (long)&p_Var20->_vptr__Sp_counted_base +
                           ((SegmentBase<duckdb::RowGroup> *)local_100._8_8_)->start +
                           local_100._40_8_;
                      p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                ((long)&p_Var23->_vptr__Sp_counted_base + 1);
                    } while (p_Var23 < (ulong)local_100._0_8_);
                  }
                }
                else {
                  pCVar13 = GetColumn((RowGroup *)local_100._8_8_,pvVar12->index);
                  iVar19 = state->vector_index;
                  _Var4._M_head_impl =
                       (state->column_scans).
                       super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                       .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
                  pvVar16 = vector<duckdb::Vector,_true>::operator[]
                                      ((vector<duckdb::Vector,_true> *)local_100._16_8_,uVar24);
                  in_stack_fffffffffffffed8.ptr = in_stack_fffffffffffffed8.ptr & 0xffffffff00000000
                  ;
                  (*pCVar13->_vptr_ColumnData[0xf])
                            (pCVar13,iVar19,_Var4._M_head_impl + uVar24,pvVar16,local_100 + 0x40,
                             local_100._0_8_,in_stack_fffffffffffffed8.ptr);
                }
              }
              uVar24 = uVar24 + 1;
              pTVar22 = (TableScanState *)local_100._24_8_;
            } while (uVar24 < (ulong)((long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                            (local_100._24_8_ + 0x1c0))->_vptr__Sp_counted_base -
                                      *(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                (local_100._24_8_ + 0x1b0))->_M_use_count >> 5));
          }
          ScanFilterInfo::EndFilter
                    ((ScanFilterInfo *)local_100._48_8_,(AdaptiveFilterState)local_98.__d.__r);
          bVar7 = false;
          p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._0_8_;
        }
        if (aStack_b0.super___atomic_base<unsigned_long>._M_i != 0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     aStack_b0.super___atomic_base<unsigned_long>._M_i);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0110591e;
      }
    }
    else {
      NextVector((RowGroup *)local_100._8_8_,state);
      bVar7 = true;
    }
    if (!bVar7) {
      return;
    }
  } while( true );
}

Assistant:

void RowGroup::TemplatedScan(TransactionData transaction, CollectionScanState &state, DataChunk &result) {
	const bool ALLOW_UPDATES = TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_DISALLOW_UPDATES &&
	                           TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED;
	const auto &column_ids = state.GetColumnIds();
	auto &filter_info = state.GetFilterInfo();
	while (true) {
		if (state.vector_index * STANDARD_VECTOR_SIZE >= state.max_row_group_row) {
			// exceeded the amount of rows to scan
			return;
		}
		idx_t current_row = state.vector_index * STANDARD_VECTOR_SIZE;
		auto max_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, state.max_row_group_row - current_row);

		// check the sampling info if we have to sample this chunk
		if (state.GetSamplingInfo().do_system_sample &&
		    state.random.NextRandom() > state.GetSamplingInfo().sample_rate) {
			NextVector(state);
			continue;
		}

		//! first check the zonemap if we have to scan this partition
		if (!CheckZonemapSegments(state)) {
			continue;
		}

		// second, scan the version chunk manager to figure out which tuples to load for this transaction
		idx_t count;
		if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
			count = state.row_group->GetSelVector(transaction, state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else if (TYPE == TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED) {
			count = state.row_group->GetCommittedSelVector(transaction.start_time, transaction.transaction_id,
			                                               state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else {
			count = max_count;
		}
		auto &block_manager = GetBlockManager();
#ifndef DUCKDB_ALTERNATIVE_VERIFY
		// // in regular operation we only prefetch from remote file systems
		// // when alternative verify is set, we always prefetch for testing purposes
		if (block_manager.IsRemote())
#else
		if (!block_manager.InMemory())
#endif
		{
			PrefetchState prefetch_state;
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (!column.IsRowIdColumn()) {
					GetColumn(column).InitializePrefetch(prefetch_state, state.column_scans[i], max_count);
				}
			}
			auto &buffer_manager = block_manager.buffer_manager;
			buffer_manager.Prefetch(prefetch_state.blocks);
		}

		bool has_filters = filter_info.HasFilters();
		if (count == max_count && !has_filters) {
			// scan all vectors completely: full scan without deletions or table filters
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					// scan row id
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].Sequence(UnsafeNumericCast<int64_t>(this->start + current_row), 1, count);
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE != TableScanType::TABLE_SCAN_REGULAR) {
						col_data.ScanCommitted(state.vector_index, state.column_scans[i], result.data[i],
						                       ALLOW_UPDATES);
					} else {
						col_data.Scan(transaction, state.vector_index, state.column_scans[i], result.data[i]);
					}
				}
			}
		} else {
			// partial scan: we have deletions or table filters
			idx_t approved_tuple_count = count;
			SelectionVector sel;
			if (count != max_count) {
				sel.Initialize(state.valid_sel);
			} else {
				sel.Initialize(nullptr);
			}
			//! first, we scan the columns with filters, fetch their data and generate a selection vector.
			//! get runtime statistics
			auto adaptive_filter = filter_info.GetAdaptiveFilter();
			auto filter_state = filter_info.BeginFilter();
			if (has_filters) {
				D_ASSERT(ALLOW_UPDATES);
				auto &filter_list = filter_info.GetFilterList();
				for (idx_t i = 0; i < filter_list.size(); i++) {
					auto filter_idx = adaptive_filter->permutation[i];
					auto &filter = filter_list[filter_idx];
					if (filter.IsAlwaysTrue()) {
						// this filter is always true - skip it
						continue;
					}
					auto &table_filter_state = *filter.filter_state;

					const auto scan_idx = filter.scan_column_index;
					const auto column_idx = filter.table_column_index;

					auto &result_vector = result.data[scan_idx];
					if (column_idx == COLUMN_IDENTIFIER_ROW_ID) {
						// We do another quick statistics scan for row ids here
						const auto rowid_start = this->start + current_row;
						const auto rowid_end = this->start + current_row + max_count;
						const auto prune_result = CheckRowIdFilter(filter.filter, rowid_start, rowid_end);
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
							// We can just break out of the loop here.
							approved_tuple_count = 0;
							continue;
						}

						// Generate row ids
						// Create sequence for row ids
						D_ASSERT(result_vector.GetType().InternalType() == ROW_TYPE);
						result_vector.SetVectorType(VectorType::FLAT_VECTOR);
						auto result_data = FlatVector::GetData<int64_t>(result_vector);
						for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
							result_data[sel.get_index(sel_idx)] =
							    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
						}

						// Was this filter always true? If so, we dont need to apply it
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
							continue;
						}

						// Now apply the filter
						UnifiedVectorFormat vdata;
						result_vector.ToUnifiedFormat(approved_tuple_count, vdata);
						ColumnSegment::FilterSelection(sel, result_vector, vdata, filter.filter, table_filter_state,
						                               approved_tuple_count, approved_tuple_count);

					} else {
						auto &col_data = GetColumn(filter.table_column_index);
						col_data.Filter(transaction, state.vector_index, state.column_scans[scan_idx], result_vector,
						                sel, approved_tuple_count, filter.filter, table_filter_state);
					}
				}
				for (auto &table_filter : filter_list) {
					if (table_filter.IsAlwaysTrue()) {
						continue;
					}
					result.data[table_filter.scan_column_index].Slice(sel, approved_tuple_count);
				}
			}
			if (approved_tuple_count == 0) {
				// all rows were filtered out by the table filters
				D_ASSERT(has_filters);
				result.Reset();
				// skip this vector in all the scans that were not scanned yet
				for (idx_t i = 0; i < column_ids.size(); i++) {
					auto &col_idx = column_ids[i];
					if (col_idx.IsRowIdColumn()) {
						continue;
					}
					if (has_filters && filter_info.ColumnHasFilters(i)) {
						continue;
					}
					auto &col_data = GetColumn(col_idx);
					col_data.Skip(state.column_scans[i]);
				}
				state.vector_index++;
				continue;
			}
			//! Now we use the selection vector to fetch data for the other columns.
			for (idx_t i = 0; i < column_ids.size(); i++) {
				if (has_filters && filter_info.ColumnHasFilters(i)) {
					// column has already been scanned as part of the filtering process
					continue;
				}
				auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].SetVectorType(VectorType::FLAT_VECTOR);
					auto result_data = FlatVector::GetData<int64_t>(result.data[i]);
					for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
						result_data[sel_idx] =
						    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
					}
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
						col_data.Select(transaction, state.vector_index, state.column_scans[i], result.data[i], sel,
						                approved_tuple_count);
					} else {
						col_data.SelectCommitted(state.vector_index, state.column_scans[i], result.data[i], sel,
						                         approved_tuple_count, ALLOW_UPDATES);
					}
				}
			}
			filter_info.EndFilter(filter_state);

			D_ASSERT(approved_tuple_count > 0);
			count = approved_tuple_count;
		}
		result.SetCardinality(count);
		state.vector_index++;
		break;
	}
}